

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# application.cpp
# Opt level: O0

void __thiscall application::application(application *this)

{
  unsigned_long maximum_size;
  anon_class_8_1_8991fb9c local_30;
  allocator<char> local_21;
  native_handle_type local_20 [4];
  application *local_10;
  application *this_local;
  
  *(pointer *)
   ((long)&(this->_cab_manager)._rnet._g.super_type.m_vertices.
           super__Vector_base<boost::detail::adj_list_gen<boost::adjacency_list<boost::listS,_boost::vecS,_boost::directedS,_node_type,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::listS,_boost::directedS,_node_type,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::listS,_boost::vecS,_boost::directedS,_node_type,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::listS,_boost::directedS,_node_type,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex>_>
           ._M_impl + 8) = (pointer)0x0;
  *(pointer *)
   ((long)&(this->_cab_manager)._rnet._g.super_type.m_vertices.
           super__Vector_base<boost::detail::adj_list_gen<boost::adjacency_list<boost::listS,_boost::vecS,_boost::directedS,_node_type,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::listS,_boost::directedS,_node_type,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::listS,_boost::vecS,_boost::directedS,_node_type,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::listS,_boost::directedS,_node_type,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex>_>
           ._M_impl + 0x10) = (pointer)0x0;
  *(size_t *)
   ((long)&(this->_cab_manager)._rnet._g.super_type.m_edges.
           super__List_base<boost::list_edge<unsigned_long,_boost::no_property>,_std::allocator<boost::list_edge<unsigned_long,_boost::no_property>_>_>
           ._M_impl + 0x10) = 0;
  (this->_cab_manager)._rnet._g.super_type.m_vertices.
  super__Vector_base<boost::detail::adj_list_gen<boost::adjacency_list<boost::listS,_boost::vecS,_boost::directedS,_node_type,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::listS,_boost::directedS,_node_type,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::listS,_boost::vecS,_boost::directedS,_node_type,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::listS,_boost::directedS,_node_type,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_cab_manager)._rnet._g.super_type.m_edges.
  super__List_base<boost::list_edge<unsigned_long,_boost::no_property>,_std::allocator<boost::list_edge<unsigned_long,_boost::no_property>_>_>
  ._M_impl._M_node.super__List_node_base._M_next = 0;
  *(_List_node_base **)
   ((long)&(this->_cab_manager)._rnet._g.super_type.m_edges.
           super__List_base<boost::list_edge<unsigned_long,_boost::no_property>,_std::allocator<boost::list_edge<unsigned_long,_boost::no_property>_>_>
           ._M_impl + 8) = (_List_node_base *)0x0;
  (this->_cab_manager)._cabs_at_node._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       (_Base_ptr)0x0;
  (this->_cab_manager)._cabs_at_node._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->_cab_manager)._cabs_at_node._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->_cab_manager)._cabs_at_node._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       (_Base_ptr)0x0;
  *(undefined8 *)&(this->_cab_manager)._cabs_at_node._M_t._M_impl = 0;
  *(undefined8 *)&(this->_cab_manager)._cabs_at_node._M_t._M_impl.super__Rb_tree_header._M_header =
       0;
  (this->_cab_manager)._cabs._M_h._M_single_bucket = (__node_base_ptr)0x0;
  *(undefined8 *)&(this->_cab_manager)._counter = 0;
  *(undefined8 *)&(this->_cab_manager)._cabs._M_h._M_rehash_policy = 0;
  (this->_cab_manager)._cabs._M_h._M_rehash_policy._M_next_resize = 0;
  (this->_cab_manager)._cabs._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->_cab_manager)._cabs._M_h._M_element_count = 0;
  (this->_cab_manager)._cabs._M_h._M_buckets = (__buckets_ptr)0x0;
  (this->_cab_manager)._cabs._M_h._M_bucket_count = 0;
  (this->_cab_manager)._rnet._g.m_property.px = (no_property *)0x0;
  local_10 = this;
  cab_manager::cab_manager(&this->_cab_manager);
  boost::asio::io_context::io_context(&this->_io_service);
  std::unique_ptr<cab_server,std::default_delete<cab_server>>::
  unique_ptr<std::default_delete<cab_server>,void>
            ((unique_ptr<cab_server,std::default_delete<cab_server>> *)&this->_cab_server);
  boost::asio::
  basic_signal_set<boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
  ::basic_signal_set<boost::asio::io_context>(&this->_signals,&this->_io_service,2,(type *)0x0);
  local_20[0] = 0;
  boost::asio::posix::
  basic_stream_descriptor<boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
  ::basic_stream_descriptor<boost::asio::io_context>
            (&this->_command_descriptor,&this->_io_service,local_20,(type *)0x0);
  maximum_size = std::numeric_limits<unsigned_long>::max();
  std::allocator<char>::allocator();
  boost::asio::basic_streambuf<std::allocator<char>_>::basic_streambuf
            (&this->_command_buffer,maximum_size,&local_21);
  std::allocator<char>::~allocator(&local_21);
  local_30.this = this;
  boost::asio::
  basic_signal_set<boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>
  ::async_wait<application::application()::__0>
            ((basic_signal_set<boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>
              *)&this->_signals,&local_30);
  handle_command(this);
  return;
}

Assistant:

application::application():
    _cab_manager(),
    _io_service(),
    _cab_server(),
    _signals(_io_service, SIGINT),
    _command_descriptor(_io_service, STDIN_FILENO),
    _command_buffer()
{
    _signals.async_wait([this](const boost::system::error_code& error_code, int signal)
    {
        if(!error_code)
        {
            std::cout << "Received SIGINT\n";
            _io_service.stop();
        }
    });

    handle_command();
}